

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O2

int YPSpur_md_adjust_pos(YPSpur *spur,int cs,double x,double y,double theta)

{
  int iVar1;
  YPSpur_msg msg;
  
  msg.msg_type = 1;
  msg.pid = (long)spur->pid;
  msg.type = 0x57;
  msg.cs = cs;
  msg.data[0] = x;
  msg.data[1] = y;
  msg.data[2] = theta;
  iVar1 = (*(spur->dev).send)(&spur->dev,&msg);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    iVar1 = -1;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int YPSpur_md_adjust_pos(YPSpur* spur, int cs, double x, double y, double theta)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_ADJUST;
  msg.data[0] = x;
  msg.data[1] = y;
  msg.data[2] = theta;
  msg.cs = cs;

  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }
  return 1;
}